

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hooking.cpp
# Opt level: O3

void __thiscall
ChickenHook::trampoline_receiver(ChickenHook *this,int param_1,siginfo_t *si,void *arg)

{
  ulong uVar1;
  double dVar2;
  undefined8 *puVar3;
  void *pvVar4;
  void *pvVar5;
  undefined4 in_register_00000034;
  undefined4 *puVar6;
  undefined8 *puVar7;
  undefined4 in_XMM0_Da;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 in_XMM0_Db;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  Trampoline trampoline;
  Trampoline local_c8;
  
  puVar6 = (undefined4 *)CONCAT44(in_register_00000034,param_1);
  dVar2 = log((double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
  uVar8 = SUB84(dVar2,0);
  uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
  if (trampolines == DAT_001556c8) {
    dVar2 = log(dVar2);
    uVar8 = SUB84(dVar2,0);
    uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  puVar3 = DAT_001556c8;
  if (trampolines != DAT_001556c8) {
    puVar7 = trampolines;
    do {
      local_c8._real_call_addr = (void *)puVar7[2];
      local_c8._original_addr = (void *)*puVar7;
      local_c8._hook_addr = (void *)puVar7[1];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_c8._trampoline,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar7 + 3));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_c8._original_code,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar7 + 6));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_c8._real_call_code,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar7 + 9));
      local_c8._trampoline_lock = (mutex *)puVar7[0xc];
      local_c8.__info.dli_fname = (char *)puVar7[0xd];
      local_c8.__info.dli_fbase = (void *)puVar7[0xe];
      local_c8._132_8_ = *(undefined8 *)((long)puVar7 + 0x84);
      local_c8.__info.dli_saddr._0_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)puVar7 + 0x7c) >> 0x20);
      local_c8.__info.dli_sname._0_4_ = (undefined4)puVar7[0xf];
      local_c8.__info.dli_sname._4_4_ = (undefined4)((ulong)puVar7[0xf] >> 0x20);
      pvVar5 = *(void **)(puVar6 + 4);
      pvVar4 = Trampoline::getOriginal(&local_c8);
      uVar8 = extraout_XMM0_Da;
      uVar9 = extraout_XMM0_Db;
      if (pvVar4 <= pvVar5) {
        uVar1 = *(ulong *)(puVar6 + 4);
        pvVar5 = Trampoline::getOriginal(&local_c8);
        uVar8 = extraout_XMM0_Da_00;
        uVar9 = extraout_XMM0_Db_00;
        if (uVar1 <= (long)pvVar5 + 0x40U) {
          log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          pvVar5 = Trampoline::getHook(&local_c8);
          dVar2 = log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
          uVar8 = SUB84(dVar2,0);
          uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
          si[1]._sifields._sigchld.si_stime = (__clock_t)pvVar5;
          *puVar6 = 0x12;
        }
      }
      if (local_c8._real_call_code.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8._real_call_code.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8._real_call_code.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8._real_call_code.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        uVar8 = extraout_XMM0_Da_02;
        uVar9 = extraout_XMM0_Db_02;
      }
      if (local_c8._original_code.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8._original_code.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8._original_code.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8._original_code.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        uVar8 = extraout_XMM0_Da_03;
        uVar9 = extraout_XMM0_Db_03;
      }
      if (local_c8._trampoline.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8._trampoline.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8._trampoline.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8._trampoline.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        uVar8 = extraout_XMM0_Da_04;
        uVar9 = extraout_XMM0_Db_04;
      }
      puVar7 = puVar7 + 0x12;
    } while (puVar7 != puVar3);
  }
  log((double)CONCAT44(uVar9,uVar8));
  return;
}

Assistant:

static void trampoline_receiver(int, siginfo_t *si, void *arg) {
        log("Caught segfault at address <%p>", si->si_addr);

        auto *p = (ucontext_t *) arg;
        if (trampolines.empty()) {
            log("Warning!! trampoline size is 0");
        }

        // search the corresponding trampoline
        for (auto trampoline : trampolines) {
            if (si->si_addr >= trampoline.getOriginal() &&
                si->si_addr <= ((uint8_t *) trampoline.getOriginal()) + CODE_SIZE) {
                log("Found hook <%p>", si->si_addr);
                void *hook = trampoline.getHook();
                auto hookFun = (void (*)()) hook;
                log("Overwrite pc");
                // now set the pc to our hook function
#if defined(__APPLE__) && (__x86_64__)
                p->uc_mcontext->__ss.__rip = reinterpret_cast<register_t>(hookFun);
#elif defined(__APPLE__) && (__i386__)
                p->uc_mcontext->__ss.__eip = reinterpret_cast<register_t>(hookFun);
#else
#ifdef __i386__
                p->uc_mcontext.gregs[REG_EIP] = reinterpret_cast<greg_t>(hookFun);
#elif __aarch64__
                p->uc_mcontext.pc = reinterpret_cast<greg_t>(hookFun);
#elif __x86_64__
                p->uc_mcontext.gregs[REG_RIP] = reinterpret_cast<greg_t>(hookFun);
#else
#error "UNSUPPORTED"
#endif
#endif
                si->si_signo = SIGCONT;
            }

        }
        log("Continue execution");
    }